

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# differentiable.cxx
# Opt level: O2

string * __thiscall
DifferentialEquation::getParameter
          (string *__return_storage_ptr__,DifferentialEquation *this,string *name)

{
  string *psVar1;
  bool bVar2;
  __type _Var3;
  ostream *poVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  string local_360 [32];
  stringstream term;
  ostream local_330;
  stringstream param;
  ostream local_1a8;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&param);
  bVar2 = std::operator==(name,"equation");
  if (bVar2) {
    poVar4 = std::operator<<(&local_1a8,"d ");
    psVar1 = &(this->super_StochasticVariable).super_StochasticProcess.super_Parametric.
              parametricName;
    std::__cxx11::string::string((string *)&term,(string *)psVar1);
    poVar4 = std::operator<<(poVar4,(string *)&term);
    std::operator<<(poVar4," = ");
    std::__cxx11::string::~string((string *)&term);
    iVar5 = 0;
    while (iVar5 < this->eqnTermAmount) {
      if (iVar5 != 0) {
        std::operator<<(&local_1a8," + ");
      }
      poVar4 = std::operator<<(&local_1a8,"f");
      iVar5 = iVar5 + 1;
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar5);
      poVar4 = std::operator<<(poVar4,"(");
      std::__cxx11::string::string((string *)&term,(string *)psVar1);
      poVar4 = std::operator<<(poVar4,(string *)&term);
      std::operator<<(poVar4,") ");
      std::__cxx11::string::~string((string *)&term);
      poVar4 = std::operator<<(&local_1a8,"d X");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar5);
      std::operator<<(poVar4," ");
    }
  }
  else {
    bVar2 = std::operator==(name,"starting-value");
    if (bVar2) {
      std::ostream::_M_insert<double>(this->eqnX0);
    }
    else {
      bVar2 = std::operator==(name,"mode");
      if (bVar2) {
        pcVar6 = "stratonovitch";
        if ((code *)this->eqnMethodPtr == stepEulerIto && *(long *)&this->field_0x158 == 0) {
          pcVar6 = "ito";
        }
        std::operator<<(&local_1a8,pcVar6);
      }
      else {
        for (iVar5 = 1;
            (ulong)(iVar5 - 1) <
            (ulong)((long)(this->eqnIntegrands).
                          super__Vector_base<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->eqnIntegrands).
                          super__Vector_base<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3); iVar5 = iVar5 + 1) {
          std::__cxx11::stringstream::stringstream((stringstream *)&term);
          poVar4 = std::operator<<(&local_330,"f");
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          poVar4 = std::operator<<(poVar4,"(");
          std::__cxx11::string::string
                    ((string *)&local_380,
                     (string *)
                     &(this->super_StochasticVariable).super_StochasticProcess.super_Parametric.
                      parametricName);
          poVar4 = std::operator<<(poVar4,(string *)&local_380);
          std::operator<<(poVar4,")");
          std::__cxx11::string::~string((string *)&local_380);
          std::__cxx11::stringbuf::str();
          _Var3 = std::operator==(name,&local_380);
          std::__cxx11::string::~string((string *)&local_380);
          if (_Var3) {
            Parametric::getConfiguration_abi_cxx11_
                      (&local_380,
                       (Parametric *)
                       (this->eqnIntegrands).
                       super__Vector_base<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar5 - 1]);
            std::operator<<(&local_1a8,(string *)&local_380);
            std::__cxx11::string::~string((string *)&local_380);
            std::__cxx11::stringstream::~stringstream((stringstream *)&term);
            break;
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)&term);
        }
        for (iVar5 = 1; uVar7 = (ulong)(iVar5 - 1),
            uVar7 < (ulong)((long)(this->eqnIntegrands).
                                  super__Vector_base<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->eqnIntegrands).
                                  super__Vector_base<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3); iVar5 = iVar5 + 1
            ) {
          std::__cxx11::stringstream::stringstream((stringstream *)&term);
          poVar4 = std::operator<<(&local_330,"X");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::__cxx11::stringbuf::str();
          _Var3 = std::operator==(name,&local_380);
          std::__cxx11::string::~string((string *)&local_380);
          if (_Var3) {
            poVar4 = std::operator<<(&local_1a8,"\"");
            std::__cxx11::string::string
                      ((string *)&local_380,
                       (string *)
                       &((this->eqnIntegrators).
                         super__Vector_base<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar7]->super_StochasticProcess).
                        super_Parametric.parametricName);
            poVar4 = std::operator<<(poVar4,(string *)&local_380);
            poVar4 = std::operator<<(poVar4,"\" ");
            std::__cxx11::string::string
                      (local_360,
                       (string *)
                       &((this->eqnIntegrators).
                         super__Vector_base<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar7]->super_StochasticProcess).
                        super_Parametric.parametricType);
            std::operator<<(poVar4,local_360);
            std::__cxx11::string::~string(local_360);
            std::__cxx11::string::~string((string *)&local_380);
            std::__cxx11::stringstream::~stringstream((stringstream *)&term);
            break;
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)&term);
        }
      }
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&param);
  return __return_storage_ptr__;
}

Assistant:

string DifferentialEquation::getParameter( const string& name ) const
{
	stringstream param;
	
	// formula
	if (name=="equation") {
		param << "d " << getName() << " = ";
		for (int i=0; i<eqnTermAmount; ++i) {
			if (i) param << " + ";
			param << "f" << i+1 << "(" << getName() << ") ";
			param << "d X" << i+1 << " ";
		}
	}
	
	// first value
	else if (name=="starting-value")
		param << getStartingValue();
	
	// mode
	else if (name=="mode")
		param << (isIto() ? "ito" : "stratonovitch");
	
	// parameters for single terms
	else {
		
		// parameters for integrands
		for (uint i=0; i<eqnIntegrands.size(); ++i) {
			stringstream term;
			term << "f" << i+1 << "(" << getName() << ")";
			if (name == term.str()) {
				param << eqnIntegrands[i]->getConfiguration();
				break;
			}
		}
			
		// parameters for integrators
		for (uint i=0; i<eqnIntegrands.size(); ++i) {
			stringstream term;
			term << "X" << i+1;
			if (name == term.str()) {
				param << "\"" << eqnIntegrators[i]->getName() << "\" " << eqnIntegrators[i]->getType();
				break;
			}
		}
	}
	
	return param.str();
}